

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

string * leveldb::CurrentFileName(string *__return_storage_ptr__,string *dbname)

{
  std::operator+(__return_storage_ptr__,dbname,"/CURRENT");
  return __return_storage_ptr__;
}

Assistant:

std::string CurrentFileName(const std::string& dbname) {
  return dbname + "/CURRENT";
}